

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaANCF_3843::ComputeKRMmatricesGlobal
          (ChElementHexaANCF_3843 *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar3 [64];
  undefined1 in_register_00001248 [56];
  undefined1 auVar4 [64];
  
  auVar4._8_56_ = in_register_00001248;
  auVar4._0_8_ = Rfactor;
  auVar3._8_56_ = in_register_00001208;
  auVar3._0_8_ = Kfactor;
  if (((H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_rows.m_value != 0x60) ||
     ((H->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value != 0x60)) {
    __assert_fail("(H.rows() == 3 * NSF) && (H.cols() == 3 * NSF)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementHexaANCF_3843.cpp"
                  ,0x1e3,
                  "virtual void chrono::fea::ChElementHexaANCF_3843::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
                 );
  }
  if (this->m_method != ContInt) {
    ComputeInternalJacobianPreInt(this,H,Kfactor,Rfactor,Mfactor);
    return;
  }
  auVar1._8_8_ = 0x8000000000000000;
  auVar1._0_8_ = 0x8000000000000000;
  auVar1 = vxorpd_avx512vl(auVar3._0_16_,auVar1);
  if (this->m_damping_enabled == true) {
    auVar2._8_8_ = 0x8000000000000000;
    auVar2._0_8_ = 0x8000000000000000;
    auVar2 = vxorpd_avx512vl(auVar4._0_16_,auVar2);
    ComputeInternalJacobianContIntDamping(this,H,auVar1._0_8_,auVar2._0_8_,Mfactor);
    return;
  }
  ComputeInternalJacobianContIntNoDamping(this,H,auVar1._0_8_,Mfactor);
  return;
}

Assistant:

void ChElementHexaANCF_3843::ComputeKRMmatricesGlobal(ChMatrixRef H, double Kfactor, double Rfactor, double Mfactor) {
    assert((H.rows() == 3 * NSF) && (H.cols() == 3 * NSF));

    if (m_method == IntFrcMethod::ContInt) {
        if (m_damping_enabled) {  // If linear Kelvin-Voigt viscoelastic material model is enabled
            ComputeInternalJacobianContIntDamping(H, -Kfactor, -Rfactor, Mfactor);
        } else {
            ComputeInternalJacobianContIntNoDamping(H, -Kfactor, Mfactor);
        }
    } else {
        ComputeInternalJacobianPreInt(H, Kfactor, Rfactor, Mfactor);
    }
}